

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void VariableDeclaration_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  void *pvVar1;
  JsObject *top;
  JsValue r3;
  JsValue r2;
  JsAstVariableDeclarationNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  if (na[1].location == (JsLocation *)0x0) {
    r3.u.completion.type = JS_COMPLETION_NORMAL;
  }
  else {
    (*JsNodeClassEval[*(uint *)&(na[1].location)->filename])
              ((JsAstNode *)na[1].location,context,(JsValue *)((long)&r3.u + 8));
  }
  JsGetValue((JsValue *)((long)&r3.u + 8),(JsValue *)&top);
  pvVar1 = JsListGet(context->scope,-1);
  (**(code **)((long)pvVar1 + 0x28))(pvVar1,*(undefined8 *)(na + 1),&top,context->varattr);
  return;
}

Assistant:

static void
VariableDeclaration_eval(na, context, res)
	struct JsAstNode *na; /* (struct VariableDeclaration_node) */
	struct JsContext *context;
	struct JsValue *res;		/* unused */
{
	struct JsAstVariableDeclarationNode *n = 
		CAST_NODE(na, JsAstVariableDeclarationNode);
	struct JsValue r2, r3;
	/*
		遇到
		var a;
		var a = 1;
		function a(){
		
		};
		的时候, 直接在当前scope中添加a = undefined; ...
	*/
	if (n->init) {
		EVAL(n->init, context, &r2);
	}else{
		//var a; 类型
		r2.type = JS_UNDEFINED;
	}
	JsGetValue(&r2, &r3);
	//直接添加到当前Scope中
	struct JsObject* top = (struct JsObject*)JsListGet(context->scope,JS_LIST_END);
	(*top->Put)(top,n->var,&r3,context->varattr);
}